

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void new_affect_to_room(ROOM_INDEX_DATA *room,ROOM_AFFECT_DATA *paf)

{
  ROOM_INDEX_DATA *pRVar1;
  ROOM_AFFECT_DATA *__dest;
  void *in_RSI;
  ROOM_INDEX_DATA *in_RDI;
  ROOM_INDEX_DATA *unaff_retaddr;
  ROOM_INDEX_DATA *pRoomIndex;
  ROOM_AFFECT_DATA *paf_new;
  ROOM_INDEX_DATA *local_20;
  
  if (in_RDI->affected == (ROOM_AFFECT_DATA *)0x0) {
    pRVar1 = in_RDI;
    if (top_affected_room != (ROOM_INDEX_DATA *)0x0) {
      for (local_20 = top_affected_room; local_20->aff_next != (ROOM_INDEX_DATA *)0x0;
          local_20 = local_20->aff_next) {
      }
      local_20->aff_next = in_RDI;
      pRVar1 = top_affected_room;
    }
    top_affected_room = pRVar1;
    in_RDI->aff_next = (ROOM_INDEX_DATA *)0x0;
  }
  __dest = new_affect_room();
  memcpy(__dest,in_RSI,0x50);
  __dest->next = in_RDI->affected;
  in_RDI->affected = __dest;
  affect_modify_room(unaff_retaddr,(ROOM_AFFECT_DATA *)in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  return;
}

Assistant:

void new_affect_to_room(ROOM_INDEX_DATA *room, ROOM_AFFECT_DATA *paf)
{
	ROOM_AFFECT_DATA *paf_new;
	ROOM_INDEX_DATA *pRoomIndex;

	if (!room->affected)
	{
		if (top_affected_room)
		{

			for (pRoomIndex = top_affected_room; pRoomIndex->aff_next != nullptr; pRoomIndex = pRoomIndex->aff_next)
			{
				continue;
			}

			pRoomIndex->aff_next = room;
		}
		else
		{
			top_affected_room = room;
		}

		room->aff_next = nullptr;
	}

	paf_new = new_affect_room();

	*paf_new = *paf;
	paf_new->next = room->affected;
	room->affected = paf_new;

	affect_modify_room(room, paf_new, true);
}